

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint32_t mipsdsp_sat32_lshift(uint32_t a,uint8_t s,CPUMIPSState_conflict5 *env)

{
  undefined4 local_28;
  uint32_t discard;
  uint8_t sign;
  CPUMIPSState_conflict5 *env_local;
  uint32_t uStack_c;
  uint8_t s_local;
  uint32_t a_local;
  
  uStack_c = a;
  if (s != '\0') {
    if ((int)a < 0) {
      local_28 = (1 << (0x20 - s & 0x1f)) + -1 << (s & 0x1f) |
                 a >> (0x1e - (s + 0xff) & 0x1f) & (1 << (s & 0x1f)) - 1U;
    }
    else {
      local_28 = a >> (0x1e - (s + 0xff) & 0x1f);
    }
    if ((local_28 == 0) || (local_28 == 0xffffffff)) {
      uStack_c = a << (s & 0x1f);
    }
    else {
      set_DSPControl_overflow_flag(1,0x16,env);
      uStack_c = 0x80000000;
      if (-1 < (int)a) {
        uStack_c = 0x7fffffff;
      }
    }
  }
  return uStack_c;
}

Assistant:

static inline uint32_t mipsdsp_sat32_lshift(uint32_t a, uint8_t s,
                                            CPUMIPSState *env)
{
    uint8_t  sign;
    uint32_t discard;

    if (s == 0) {
        return a;
    } else {
        sign = (a >> 31) & 0x01;
        if (sign != 0) {
            discard = (((0x01 << (32 - s)) - 1) << s) |
                      ((a >> (30 - (s - 1))) & ((0x01 << s) - 1));
        } else {
            discard = a >> (30 - (s - 1));
        }

        if ((discard != 0x00000000) && (discard != 0xFFFFFFFF)) {
            set_DSPControl_overflow_flag(1, 22, env);
            return (sign == 0) ? 0x7FFFFFFF : 0x80000000;
        } else {
            return a << s;
        }
    }
}